

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

int __thiscall
QPDFWriter::compareVersions(QPDFWriter *this,int major1,int minor1,int major2,int minor2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (((major2 <= major1) && (uVar1 = 1, major1 <= major2)) &&
     (uVar1 = 0xffffffff, minor2 <= minor1)) {
    uVar1 = (uint)(minor2 < minor1);
  }
  return uVar1;
}

Assistant:

int
QPDFWriter::compareVersions(int major1, int minor1, int major2, int minor2) const
{
    if (major1 < major2) {
        return -1;
    } else if (major1 > major2) {
        return 1;
    } else if (minor1 < minor2) {
        return -1;
    } else if (minor1 > minor2) {
        return 1;
    } else {
        return 0;
    }
}